

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::InitializeVacuumState
          (RowGroupCollection *this,CollectionCheckpointState *checkpoint_state,VacuumState *state,
          vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *segments)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  idx_t in_RAX;
  DataTableInfo *pDVar4;
  type this_00;
  SegmentNode<duckdb::RowGroup> *entry;
  pointer pSVar5;
  idx_t row_group_count;
  idx_t local_38;
  
  local_38 = in_RAX;
  iVar3 = (*checkpoint_state->writer->_vptr_TableDataWriter[5])();
  pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  bVar2 = TableIndexList::Empty(&pDVar4->indexes);
  state->can_vacuum_deletes = bVar2 && iVar3 == 0;
  if (bVar2 && iVar3 == 0) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&(state->row_group_counts).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (long)(segments->
                     super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ).
                     super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(segments->
                     super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ).
                     super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    pSVar1 = (segments->
             super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ).
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar5 = (segments->
                  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ).
                  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1)
    {
      this_00 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                          (&pSVar5->node);
      local_38 = RowGroup::GetCommittedRowCount(this_00);
      if (local_38 == 0) {
        RowGroup::CommitDrop(this_00);
        ::std::__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::reset
                  ((__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
                   &pSVar5->node,(pointer)0x0);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(state->row_group_counts).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&local_38);
    }
  }
  return;
}

Assistant:

void RowGroupCollection::InitializeVacuumState(CollectionCheckpointState &checkpoint_state, VacuumState &state,
                                               vector<SegmentNode<RowGroup>> &segments) {
	bool is_full_checkpoint = checkpoint_state.writer.GetCheckpointType() == CheckpointType::FULL_CHECKPOINT;
	// currently we can only vacuum deletes if we are doing a full checkpoint and there are no indexes
	state.can_vacuum_deletes = info->GetIndexes().Empty() && is_full_checkpoint;
	if (!state.can_vacuum_deletes) {
		return;
	}
	// obtain the set of committed row counts for each row group
	state.row_group_counts.reserve(segments.size());
	for (auto &entry : segments) {
		auto &row_group = *entry.node;
		auto row_group_count = row_group.GetCommittedRowCount();
		if (row_group_count == 0) {
			// empty row group - we can drop it entirely
			row_group.CommitDrop();
			entry.node.reset();
		}
		state.row_group_counts.push_back(row_group_count);
	}
}